

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int arkSetMaxNumSteps(void *arkode_mem,long mxsteps)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetMaxNumSteps","arkode_mem = NULL illegal.");
  }
  else {
    if (mxsteps == 0) {
      *(undefined8 *)((long)arkode_mem + 0x1b8) = 500;
    }
    else {
      *(long *)((long)arkode_mem + 0x1b8) = mxsteps;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkSetMaxNumSteps(void *arkode_mem, long int mxsteps)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetMaxNumSteps", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* Passing mxsteps=0 sets the default. Passing mxsteps<0 disables the test. */
  if (mxsteps == 0)
    ark_mem->mxstep = MXSTEP_DEFAULT;
  else
    ark_mem->mxstep = mxsteps;

  return(ARK_SUCCESS);
}